

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint64_t helper_dvstep(uint64_t r1,uint32_t r2)

{
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  int iVar5;
  uint64_t uVar6;
  int local_30;
  int32_t temp;
  int32_t i;
  int32_t remainder;
  int32_t dividend_quotient;
  int32_t addend;
  int32_t quotient_sign;
  int32_t divisor_sign;
  int32_t dividend_sign;
  uint32_t r2_local;
  uint64_t r1_local;
  
  uVar6 = extract64(r1,0x3f,1);
  uVar2 = (uint32_t)uVar6;
  uVar3 = extract32(r2,0x1f,1);
  uVar4 = (uint)(uVar2 != uVar3);
  remainder = r2;
  if (uVar4 == 0) {
    remainder = -r2;
  }
  local_30 = 0;
  while( true ) {
    temp = (int32_t)(r1 >> 0x20);
    i = (int32_t)r1;
    if (7 < local_30) break;
    uVar3 = extract32(i,0x1f,1);
    temp = temp << 1 | uVar3;
    iVar5 = temp + remainder;
    if (iVar5 < 0 == uVar2) {
      temp = iVar5;
    }
    uVar1 = uVar4;
    if (iVar5 < 0 == uVar2) {
      uVar1 = (uint)((uVar4 != 0 ^ 0xffU) & 1);
    }
    i = i << 1 | uVar1;
    r1 = CONCAT44(temp,i);
    local_30 = local_30 + 1;
  }
  return r1;
}

Assistant:

uint64_t helper_dvstep(uint64_t r1, uint32_t r2)
{
    int32_t dividend_sign = extract64(r1, 63, 1);
    int32_t divisor_sign = extract32(r2, 31, 1);
    int32_t quotient_sign = (dividend_sign != divisor_sign);
    int32_t addend, dividend_quotient, remainder;
    int32_t i, temp;

    if (quotient_sign) {
        addend = r2;
    } else {
        addend = -r2;
    }
    dividend_quotient = (int32_t)r1;
    remainder = (int32_t)(r1 >> 32);

    for (i = 0; i < 8; i++) {
        remainder = (remainder << 1) | extract32(dividend_quotient, 31, 1);
        dividend_quotient <<= 1;
        temp = remainder + addend;
        if ((temp < 0) == dividend_sign) {
            remainder = temp;
        }
        if (((temp < 0) == dividend_sign)) {
            dividend_quotient = dividend_quotient | !quotient_sign;
        } else {
            dividend_quotient = dividend_quotient | quotient_sign;
        }
    }
    return ((uint64_t)remainder << 32) | (uint32_t)dividend_quotient;
}